

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

BDD sylvan_cube(BDDSET vars,uint8_t *cube)

{
  int iVar1;
  uint32_t var;
  mtbddnode_t n_00;
  MTBDD vars_00;
  BDD local_38;
  BDD result;
  BDDVAR v;
  mtbddnode_t n;
  uint8_t *cube_local;
  BDDSET vars_local;
  
  iVar1 = mtbdd_set_isempty(vars);
  if (iVar1 == 0) {
    n_00 = MTBDD_GETNODE(vars);
    var = mtbddnode_getvariable(n_00);
    vars_00 = mtbddnode_followhigh(vars,n_00);
    local_38 = sylvan_cube(vars_00,cube + 1);
    if (*cube == '\0') {
      local_38 = mtbdd_makenode(var,local_38,0);
    }
    else if (*cube == '\x01') {
      local_38 = mtbdd_makenode(var,0,local_38);
    }
    vars_local = local_38;
  }
  else {
    vars_local = 0x8000000000000000;
  }
  return vars_local;
}

Assistant:

BDD
sylvan_cube(BDDSET vars, uint8_t *cube)
{
    if (sylvan_set_isempty(vars)) return sylvan_true;

    bddnode_t n = MTBDD_GETNODE(vars);
    BDDVAR v = bddnode_getvariable(n);
    vars = node_high(vars, n);

    BDD result = sylvan_cube(vars, cube+1);
    if (*cube == 0) {
        result = sylvan_makenode(v, result, sylvan_false);
    } else if (*cube == 1) {
        result = sylvan_makenode(v, sylvan_false, result);
    }

    return result;
}